

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationBasicCase::genShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char cVar1;
  int iVar2;
  _anonymous_namespace_ *this_00;
  ostream *poVar3;
  bool *code;
  char *pcVar4;
  ostringstream buf;
  Context *local_1c0 [4];
  ostringstream local_1a0 [376];
  
  cVar1 = *(char *)((long)this + 0x7c);
  iVar2 = *(int *)((long)this + 0x78);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"${GLSL_VERSION_DECL}\n");
  pcVar4 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
  code = SSBOArrayLengthTests::init::arraysSized + 1;
  if (iVar2 != 1) {
    pcVar4 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  if (cVar1 == '\0') {
    pcVar4 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"layout (local_size_x=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)this + 0x88));
  poVar3 = std::operator<<(poVar3,", local_size_y=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)this + 0x8c));
  poVar3 = std::operator<<(poVar3,") in;\n");
  poVar3 = std::operator<<(poVar3,"layout(binding=0, std430) buffer Output\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\thighp int values[];\n");
  std::operator<<(poVar3,"} sb_result;\n");
  if (*(int *)((long)this + 0x78) == 1) {
    poVar3 = std::operator<<((ostream *)local_1a0,
                             "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n"
                            );
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,
                             "\treturn ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)this + 0x84));
    pcVar4 = ");\n";
  }
  else {
    if (*(int *)((long)this + 0x78) != 0) goto LAB_0048d321;
    poVar3 = std::operator<<((ostream *)local_1a0,
                             "layout(binding=1, std430) coherent buffer Storage\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp int values[];\n");
    poVar3 = std::operator<<(poVar3,"} sb_store;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "highp int getIndex (in highp uvec2 localID, in highp int element)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,
                             "\thighp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                            );
    poVar3 = std::operator<<(poVar3,
                             "\treturn int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)this + 0x90));
    pcVar4 = " + element;\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"}\n");
LAB_0048d321:
  poVar3 = std::operator<<((ostream *)local_1a0,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,
                           "\tint resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "\tint groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n"
                          );
  poVar3 = std::operator<<(poVar3,"\tbool allOk      = true;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  (**(code **)(*this + 0x30))(local_1c0,this);
  poVar3 = std::operator<<(poVar3,(string *)local_1c0);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tsb_result.values[resultNdx] = (allOk) ? (1) : (0);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)local_1c0);
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::stringbuf::str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,local_1c0[0],code);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string InvocationBasicCase::genShaderSource (void) const
{
	const bool			useImageAtomics = m_useAtomic && m_storage == STORAGE_IMAGE;
	std::ostringstream	buf;

	buf << "${GLSL_VERSION_DECL}\n"
		<< ((useImageAtomics) ? ("${SHADER_IMAGE_ATOMIC_REQUIRE}\n") : (""))
		<< "layout (local_size_x=" << m_localWidth << ", local_size_y=" << m_localHeight << ") in;\n"
		<< "layout(binding=0, std430) buffer Output\n"
		<< "{\n"
		<< "	highp int values[];\n"
		<< "} sb_result;\n";

	if (m_storage == STORAGE_BUFFER)
		buf << "layout(binding=1, std430) coherent buffer Storage\n"
			<< "{\n"
			<< "	highp int values[];\n"
			<< "} sb_store;\n"
			<< "\n"
			<< "highp int getIndex (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	highp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "	return int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * " << m_elementsPerInvocation << " + element;\n"
			<< "}\n";
	else if (m_storage == STORAGE_IMAGE)
		buf << "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n"
			<< "\n"
			<< "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	return ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * " << m_workHeight << ");\n"
			<< "}\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	int resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
		<< "	int groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n"
		<< "	bool allOk      = true;\n"
		<< "\n"
		<< genShaderMainBlock()
		<< "\n"
		<< "	sb_result.values[resultNdx] = (allOk) ? (1) : (0);\n"
		<< "}\n";

	return specializeShader(m_context, buf.str().c_str());
}